

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessesView.cpp
# Opt level: O2

void __thiscall ProcessesView::mousePressEvent(ProcessesView *this,QMouseEvent *event)

{
  long *plVar1;
  long *plVar2;
  void **ppvVar3;
  undefined4 *puVar4;
  QString *pQVar5;
  long lVar6;
  char *s2;
  undefined4 in_stack_fffffffffffffdfc;
  anon_class_32_2_c8376635_for_function local_1e8;
  QArrayDataPointer<char16_t> local_1c8;
  anon_class_32_2_c8376635_for_function local_1b0;
  QString pid;
  QPair<const_char_*,_const_char_*> signalsList [8];
  QMenu contextMenu;
  QObject local_a8 [8];
  QArrayDataPointer<char16_t> local_a0;
  anon_class_32_2_c8376635_for_function local_88;
  QString name;
  QObject local_50 [8];
  QArrayDataPointer<char16_t> local_48;
  
  QTreeView::mousePressEvent((QMouseEvent *)this);
  _contextMenu = QMouseEvent::pos(event);
  (**(code **)(*(long *)this + 0x1f0))(signalsList,this);
  if (((int)signalsList[0].first != -1) && (*(int *)(event + 0x40) == 2)) {
    plVar1 = (long *)QAbstractItemView::model();
    plVar2 = (long *)QAbstractItemView::model();
    local_1e8.pid.d.d = (Data *)0xffffffffffffffff;
    local_1e8.pid.d.ptr = (char16_t *)0x0;
    local_1e8.pid.d.size = 0;
    (**(code **)(*plVar2 + 0x60))(&contextMenu,plVar2,(int)signalsList[0].first,0);
    (**(code **)(*plVar1 + 0x90))(signalsList,plVar1,&contextMenu,0);
    QVariant::toString();
    QVariant::~QVariant((QVariant *)signalsList);
    plVar1 = (long *)QAbstractItemView::model();
    plVar2 = (long *)QAbstractItemView::model();
    local_1e8.pid.d.d = (Data *)0xffffffffffffffff;
    local_1e8.pid.d.ptr = (char16_t *)0x0;
    local_1e8.pid.d.size = 0;
    (**(code **)(*plVar2 + 0x60))(&contextMenu,plVar2,(int)signalsList[0].first,3);
    (**(code **)(*plVar1 + 0x90))(signalsList,plVar1,&contextMenu,0);
    QVariant::toString();
    QVariant::~QVariant((QVariant *)signalsList);
    tr((QString *)signalsList,"Context menu",(char *)0x0,-1);
    QMenu::QMenu(&contextMenu,(QString *)signalsList,(QWidget *)this);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)signalsList);
    operator+((QString *)&local_1c8,"Terminate ",&name);
    operator+(&local_1b0.pid,(QString *)&local_1c8," (pid ");
    operator+(&local_1e8.pid,&local_1b0.pid,&pid);
    operator+((QString *)signalsList,&local_1e8.pid,")");
    ppvVar3 = (void **)QMenu::addAction((QString *)&contextMenu);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)signalsList);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_1e8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_1b0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1c8);
    local_a0.d = pid.d.d;
    local_a0.ptr = pid.d.ptr;
    local_a0.size = pid.d.size;
    if (pid.d.d != (Data *)0x0) {
      LOCK();
      ((pid.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((pid.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QString::QString(&local_1e8.pid,(QString *)&local_a0);
    local_1b0.pid.d.d = (Data *)QAction::triggered;
    local_1b0.pid.d.ptr = (char16_t *)0x0;
    puVar4 = (undefined4 *)operator_new(0x28);
    QString::QString((QString *)signalsList,&local_1e8.pid);
    *puVar4 = 1;
    *(code **)(puVar4 + 2) =
         QtPrivate::
         QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/congard[P]nvidia-system-monitor-qt/src/processes/ProcessesView.cpp:70:44),_0,_QtPrivate::List<>,_void>
         ::impl;
    QString::QString((QString *)(puVar4 + 4),(QString *)signalsList);
    QObject::connectImpl
              (local_a8,ppvVar3,(QObject *)&local_1b0,ppvVar3,(QSlotObjectBase *)0x0,
               (ConnectionType)puVar4,(int *)CONCAT44(in_stack_fffffffffffffdfc,1),
               (QMetaObject *)0x0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)signalsList);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_1e8);
    QMetaObject::Connection::~Connection((Connection *)local_a8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a0);
    QMenu::addSeparator();
    signalsList[0].first = "Suspend";
    signalsList[0].second = "STOP";
    signalsList[1].first = "Continue";
    signalsList[1].second = "CONT";
    signalsList[2].first = "Hangup";
    signalsList[2].second = "HUP";
    signalsList[3].first = "Interrupt";
    signalsList[3].second = "INT";
    signalsList[4].first = "Terminate";
    signalsList[4].second = "TERM";
    signalsList[5].first = "Kill";
    signalsList[5].second = "KILL";
    signalsList[6].first = "User 1";
    signalsList[6].second = "USR1";
    signalsList[7].first = "User 2";
    signalsList[7].second = "USR2";
    QString::QString(&local_1e8.pid,"Send signal");
    pQVar5 = (QString *)QMenu::addMenu((QString *)&contextMenu);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_1e8);
    for (lVar6 = 8; lVar6 != 0x88; lVar6 = lVar6 + 0x10) {
      QString::QString((QString *)&local_48,*(char **)((long)signalsList + lVar6 + -8));
      operator+((QString *)&local_1c8,(QString *)&local_48," (");
      s2 = *(char **)((long)&signalsList[0].first + lVar6);
      operator+(&local_1b0.pid,(QString *)&local_1c8,s2);
      operator+(&local_1e8.pid,&local_1b0.pid,")");
      ppvVar3 = (void **)QMenu::addAction(pQVar5);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_1e8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_1b0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1c8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
      local_88.pid.d.d = pid.d.d;
      local_88.pid.d.ptr = pid.d.ptr;
      local_88.pid.d.size = pid.d.size;
      if (pid.d.d != (Data *)0x0) {
        LOCK();
        ((pid.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((pid.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
        s2 = *(char **)((long)&signalsList[0].first + lVar6);
      }
      local_88.signal = s2;
      mousePressEvent(QMouseEvent*)::$_1::__1((__1 *)&local_1b0,&local_88);
      local_1c8.d = (Data *)QAction::triggered;
      local_1c8.ptr = (char16_t *)0x0;
      puVar4 = (undefined4 *)operator_new(0x30);
      mousePressEvent(QMouseEvent*)::$_1::__1((__1 *)&local_1e8,&local_1b0);
      *puVar4 = 1;
      *(code **)(puVar4 + 2) =
           QtPrivate::
           QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/congard[P]nvidia-system-monitor-qt/src/processes/ProcessesView.cpp:91:47),_0,_QtPrivate::List<>,_void>
           ::impl;
      mousePressEvent(QMouseEvent*)::$_1::__1((__1 *)(puVar4 + 4),&local_1e8);
      QObject::connectImpl
                (local_50,ppvVar3,(QObject *)&local_1c8,ppvVar3,(QSlotObjectBase *)0x0,
                 (ConnectionType)puVar4,(int *)CONCAT44(in_stack_fffffffffffffdfc,1),
                 (QMetaObject *)0x0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_1e8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_1b0);
      QMetaObject::Connection::~Connection((Connection *)local_50);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_88);
    }
    local_1b0.pid.d.d = (Data *)QMouseEvent::pos(event);
    local_1e8.pid.d.d = (Data *)QWidget::mapToGlobal((QPoint *)this);
    QMenu::exec((QPoint *)&contextMenu,(QAction *)&local_1e8);
    QMenu::~QMenu(&contextMenu);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&pid.d);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&name.d);
  }
  return;
}

Assistant:

void ProcessesView::mousePressEvent(QMouseEvent *event) {
    QTreeView::mousePressEvent(event);
    int row = indexAt(event->pos()).row();

    if (event->button() == Qt::RightButton && row != -1) {
        QString name = model()->data(model()->index(row, NVSMColumns::Name)).toString();
        QString pid = model()->data(model()->index(row, NVSMColumns::PID)).toString();

        QMenu contextMenu(tr("Context menu"), this);

        QAction *kill = contextMenu.addAction("Terminate " + name + " (pid " + pid + ")");
        connect(kill, &QAction::triggered, [pid]() {
            Utils::exec_cmd("kill " + pid);
        });

        contextMenu.addSeparator();

        QPair<const char*, const char*> signalsList[] = {
            {"Suspend", "STOP"},
            {"Continue", "CONT"},
            {"Hangup", "HUP"},
            {"Interrupt", "INT"},
            {"Terminate", "TERM"},
            {"Kill", "KILL"},
            {"User 1", "USR1"},
            {"User 2", "USR2"}
        };

        QMenu *signalMenu = contextMenu.addMenu("Send signal");

        for (auto &sig : signalsList) {
            QAction *act = signalMenu->addAction(QString(sig.first) + " (" + sig.second + ")");
            connect(act, &QAction::triggered, [pid, signal = sig.second]() {
                Utils::exec_cmd("kill -" + QString(signal) + " " + pid);
            });
        }

        contextMenu.exec(mapToGlobal(event->pos()));
    }
}